

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tld.c
# Opt level: O0

int faup_tld_download_mozilla_list(char *store_to_file)

{
  FILE *__stream;
  char *apcVar1 [1];
  int iVar2;
  int *piVar3;
  char *pcVar4;
  int retval;
  char *newenviron [1];
  char *newargv [5];
  char *download_program;
  char *store_to_file_local;
  
  newenviron[0] = (char *)0x0;
  memset(&stack0xffffffffffffffb0,0,8);
  fprintf(_stdout,"Downloading new TLD list to %s\n",store_to_file);
  newenviron[0] = getenv("FAUP_DOWNLOAD_PROGRAM");
  if (newenviron[0] == (char *)0x0) {
    newenviron[0] = "/usr/bin/curl";
  }
  if (newenviron[0] == (char *)0x0) {
    store_to_file_local._4_4_ = -1;
  }
  else {
    iVar2 = execve(newenviron[0],newenviron,(char **)&stack0xffffffffffffffb0);
    apcVar1[0] = newenviron[0];
    __stream = _stderr;
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(__stream,"execve on %s failed. Reason: %s\n",apcVar1[0],pcVar4);
      store_to_file_local._4_4_ = -1;
    }
    else {
      store_to_file_local._4_4_ = 0;
    }
  }
  return store_to_file_local._4_4_;
}

Assistant:

int faup_tld_download_mozilla_list(char *store_to_file) 
{
	char *download_program;
	char *newargv[] = { NULL, MOZILLA_TLD_LIST_URL, "--output", store_to_file, NULL };
	char *newenviron[] = { NULL };
	int retval = -1;
	
	fprintf(stdout, "Downloading new TLD list to %s\n", store_to_file);

	download_program = getenv("FAUP_DOWNLOAD_PROGRAM");
	if (!download_program) {
		newargv[0] = "/usr/bin/curl";
	} else {
		newargv[0] = download_program;
	}

	if (!newargv[0]) {
		return -1;
	}
	retval = execve(newargv[0], newargv, newenviron);
	if (retval == -1) {
		fprintf(stderr, "execve on %s failed. Reason: %s\n", newargv[0], strerror(errno));
		return -1;
	}

	return 0;
}